

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_parser_parseTokens
          (sysbvm_context_t *context,sysbvm_tuple_t sourceCode,sysbvm_tuple_t tokenSequence)

{
  int iVar1;
  sysbvm_tuple_t pragmas;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  size_t sVar4;
  anon_struct_8_1_6971b95b gcFrame;
  sysbvm_parser_state_t parserState;
  sysbvm_tuple_t local_70;
  sysbvm_parser_state_t local_68;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  sysbvm_tuple_t *local_30;
  
  local_30 = &local_70;
  local_70 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 1;
  sysbvm_stackFrame_pushRecord(&local_48);
  sysbvm_gc_lock(context);
  local_68.tokenPosition = 0;
  local_68.sourceCode = sourceCode;
  local_68.tokenSequence = tokenSequence;
  local_68.tokenSequenceSize = sysbvm_arraySlice_getSize(tokenSequence);
  pragmas = sysbvm_parser_parsePragmaList(context,&local_68);
  sVar2 = sysbvm_orderedCollection_create(context);
  iVar1 = sysbvm_parser_lookKindAt(&local_68,0);
  if (-1 < iVar1) {
    do {
      iVar1 = sysbvm_parser_lookKindAt(&local_68,0);
      sVar4 = local_68.tokenPosition;
      while (iVar1 == 0x18) {
        sVar4 = sVar4 + 1;
        local_68.tokenPosition = sVar4;
        iVar1 = sysbvm_parser_lookKindAt(&local_68,0);
      }
      sVar3 = sysbvm_parser_parseCommaExpression(context,&local_68);
      if (sVar3 == 0) break;
      sysbvm_orderedCollection_add(context,sVar2,sVar3);
      iVar1 = sysbvm_parser_lookKindAt(&local_68,0);
      if (iVar1 != 0x18) break;
      iVar1 = sysbvm_parser_lookKindAt(&local_68,0);
      sVar4 = local_68.tokenPosition;
      while (iVar1 == 0x18) {
        sVar4 = sVar4 + 1;
        local_68.tokenPosition = sVar4;
        iVar1 = sysbvm_parser_lookKindAt(&local_68,0);
      }
      iVar1 = sysbvm_parser_lookKindAt(&local_68,0);
    } while (-1 < iVar1);
  }
  sVar2 = sysbvm_orderedCollection_asArray(context,sVar2);
  sVar3 = sysbvm_parser_makeSourcePositionForTokenRange
                    (context,local_68.sourceCode,local_68.tokenSequence,0,local_68.tokenPosition);
  local_70 = sysbvm_astSequenceNode_create(context,sVar3,pragmas,sVar2);
  sysbvm_gc_unlock(context);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_70;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_parser_parseTokens(sysbvm_context_t *context, sysbvm_tuple_t sourceCode, sysbvm_tuple_t tokenSequence)
{
    struct {
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_gc_lock(context);
    sysbvm_parser_state_t parserState = {
        .sourceCode = sourceCode,
        .tokenSequence = tokenSequence,
        .tokenPosition = 0,
        .tokenSequenceSize = sysbvm_arraySlice_getSize(tokenSequence),
    };

    gcFrame.result = sysbvm_parser_parseSequence(context, &parserState);
    sysbvm_gc_unlock(context);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}